

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Animator_Do_proc(Am_Object *interp)

{
  Am_Value *pAVar1;
  Am_Value local_60;
  undefined1 local_50 [8];
  Am_Value value;
  Am_Object local_38 [3];
  undefined1 local_20 [8];
  Am_Value value_2;
  Am_Object *interp_local;
  
  value_2.value = (anon_union_8_8_ea4c8939_for_value)interp;
  pAVar1 = Am_Object::Get(interp,0x182,0);
  Am_Value::Am_Value((Am_Value *)local_20,pAVar1);
  Am_Object::Set(interp,0x169,(Am_Value *)local_20,0);
  Am_Object::Am_Object(local_38,interp);
  Am_Stop_Timer(local_38,0xe8);
  Am_Object::~Am_Object(local_38);
  Am_Object::Am_Object((Am_Object *)&value.value,interp);
  Am_Set_Animated_Slots((Am_Object *)&value.value);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_50);
  pAVar1 = Am_Object::Peek(interp,0xc5,0);
  Am_Value::operator=((Am_Value *)local_50,pAVar1);
  Am_Value::Am_Value(&local_60,(Am_Value *)local_50);
  call_all_commands(&local_60,0xca,interp,false);
  Am_Value::~Am_Value(&local_60);
  Am_Value::~Am_Value((Am_Value *)local_50);
  Am_Value::~Am_Value((Am_Value *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animator_Do, (Am_Object interp))
{
  Am_Value value_2 = interp.Get(Am_VALUE_2);
  Am_INTER_TRACE_PRINT(
      interp, "Animator Do of " << interp << " setting value to " << value_2);
  // assert final value and stop the timer
  interp.Set(Am_VALUE, value_2);
  Am_Stop_Timer(interp, Am_ANIMATION_METHOD);

  Am_Set_Animated_Slots(interp);

  Am_Value value;
  value = interp.Peek(Am_COMMAND);
  call_all_commands(value, Am_DO_METHOD, interp, false);
}